

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 make_ci_list_frm_mdef(char *mdeffile,char ***CIlist,int32 *cilistsize)

{
  int32 iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  model_def_t *local_40;
  model_def_t *mdef;
  int32 phnsize;
  int32 maxphnsize;
  int32 id;
  int32 nciphns;
  char **cilist;
  int32 *cilistsize_local;
  char ***CIlist_local;
  char *mdeffile_local;
  
  cilist = (char **)cilistsize;
  cilistsize_local = (int32 *)CIlist;
  CIlist_local = (char ***)mdeffile;
  iVar1 = model_def_read(&local_40,mdeffile);
  if (iVar1 != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x50,"Unable to read mdef file %s\n",CIlist_local);
  }
  maxphnsize = local_40->acmod_set->n_ci;
  *(int32 *)cilist = maxphnsize;
  mdef._4_4_ = 0;
  for (phnsize = 0; phnsize < maxphnsize; phnsize = phnsize + 1) {
    pcVar2 = acmod_set_id2name(local_40->acmod_set,phnsize);
    sVar3 = strlen(pcVar2);
    mdef._0_4_ = (int)sVar3;
    if (mdef._4_4_ < (int)mdef) {
      mdef._4_4_ = (int)mdef;
    }
  }
  _id = __ckd_calloc_2d__((long)maxphnsize,(long)(mdef._4_4_ + 1),1,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                          ,0x59);
  *(void **)cilistsize_local = _id;
  for (phnsize = 0; phnsize < maxphnsize; phnsize = phnsize + 1) {
    pcVar2 = *(char **)((long)_id + (long)phnsize * 8);
    __src = acmod_set_id2name(local_40->acmod_set,phnsize);
    strcpy(pcVar2,__src);
  }
  return 0;
}

Assistant:

int32 make_ci_list_frm_mdef(const char  *mdeffile,
		            char  ***CIlist, 
                            int32 *cilistsize)
{
    char  **cilist;

    int32 nciphns, id, maxphnsize, phnsize;
    model_def_t *mdef;

    if (model_def_read(&mdef, mdeffile) != S3_SUCCESS) 
	E_ERROR("Unable to read mdef file %s\n",mdeffile);
    *cilistsize = nciphns = mdef->acmod_set->n_ci;

   /* Find phone length */
    maxphnsize = 0;
    for (id = 0; id < nciphns; id++){
	phnsize = strlen(acmod_set_id2name(mdef->acmod_set,id));
 	if (phnsize > maxphnsize) maxphnsize = phnsize;
    }
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (id = 0; id < nciphns; id++){
        strcpy(cilist[id],acmod_set_id2name(mdef->acmod_set,id));
    }

    return S3_SUCCESS;
}